

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O1

bool __thiscall gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors(Errors *this)

{
  int iVar1;
  bool bVar2;
  GLchar *pGVar3;
  int iVar4;
  int value;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  if (testTwoDimmensionalTextureErrors()::test_textures == '\0') {
    testTwoDimmensionalTextureErrors(this);
  }
  bVar2 = true;
  lVar7 = 8;
  do {
    (*this->m_gl_GetTextureSubImage)
              (*(GLuint *)(lVar7 + 0x21dc798),0,0,0,1,2,
               (*(GLuint *)(lVar7 + 0x21dc798) != 0xde0) + 1,2,0x1908,0x1401,0x10,
               this->m_destination_buffer);
    value = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    iVar1 = (int)(ostringstream *)&local_1a8;
    if (value != 0x501) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective target is "
                 ,0x66);
      pcVar6 = *(char **)((long)&testTwoDimmensionalTextureErrors::test_textures[0].id + lVar7);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)local_1a8[-3]);
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                 ,0x7f);
      pcVar6 = glu::getErrorName(value);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)local_1a8[-3]);
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," was generated.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  if (testTwoDimmensionalTextureErrors()::test_compressed_textures == '\0') {
    testTwoDimmensionalTextureErrors(this);
  }
  (*this->m_gl_GetCompressedTextureSubImage)
            (testTwoDimmensionalTextureErrors::test_compressed_textures[0].id,0,0,0,1,4,4,2,0x10,
             this->m_destination_buffer);
  iVar4 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  if (iVar4 != 0x501) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if the effective target is "
               ,0x70);
    pGVar3 = testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name;
    if (testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name == (GLchar *)0x0)
    {
      std::ios::clear(iVar1 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pGVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
               ,0x7f);
    pcVar6 = glu::getErrorName(iVar4);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a8[-3]);
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," was generated.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_textures[] = { { m_texture_1D, "GL_TEXTURE_1D" },
						  { m_texture_1D_array, "GL_TEXTURE_1D_ARRAY" },
						  { m_texture_2D, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_textures_size = sizeof(test_textures) / sizeof(test_textures[0]);

	glw::GLint is_error = true;

	for (glw::GLuint i = 0; i < test_textures_size; ++i)
	{
		m_gl_GetTextureSubImage(test_textures[i].id, 0, 0, 0, 1, s_texture_data_width,
								(test_textures[i].id == GL_TEXTURE_1D) ? 1 : s_texture_data_height, 2, GL_RGBA,
								GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

		glw::GLint error_value	 = gl.getError();
		glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error)
		{
			is_error = false;

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective"
				   " target is "
				<< test_textures[i].target_name << " and either zoffset is not zero, or depth"
												   " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
												   " However, the error value "
				<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	/* Test (compressed textures). */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_compressed_textures[] = { { m_texture_2D_compressed, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_compressed_textures_size =
		sizeof(test_compressed_textures) / sizeof(test_compressed_textures[0]);

	for (glw::GLuint i = 0; i < test_compressed_textures_size; ++i)
	{
		m_gl_GetCompressedTextureSubImage(test_compressed_textures[i].id, 0, 0, 0, 1, s_texture_data_compressed_width,
										  s_texture_data_compressed_height, 2, s_destination_buffer_size,
										  m_destination_buffer);

		glw::GLint error_value = gl.getError();

		glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error_compressed)
		{
			is_error = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_VALUE error is expected to be generated by "
														   "glGetCompressedTextureSubImage if the effective"
														   " target is "
							   << test_compressed_textures[i].target_name
							   << " and either zoffset is not zero, or depth"
								  " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
								  " However, the error value "
							   << glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	if (is_error)
	{
		return true;
	}

	return false;
}